

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::BilinearPatch::Sample(BilinearPatch *this,Point2f u)

{
  initializer_list<float> v_00;
  span<const_float> w_00;
  span<const_float> w_01;
  Point2f u_00;
  bool bVar1;
  Tuple3<pbrt::Point3,_float> *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar2;
  undefined4 uVar3;
  type tVar4;
  double dVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Point3<float> PVar40;
  Vector3<float> VVar41;
  Tuple3<pbrt::Normal3,_float> TVar42;
  Vector3f pError;
  Normal3f n;
  Vector3f dpdv;
  Vector3f dpdu;
  Point3f p;
  Point3f pu1;
  Point3f pu0;
  array<float,_4> w;
  Point2f uv;
  Float pdf;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  ShapeSample *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffa88;
  Point3fi *pi;
  span<const_float> *in_stack_fffffffffffffa90;
  Interaction *this_00;
  undefined4 in_stack_fffffffffffffa98;
  Float FVar43;
  int i;
  Point3fi *this_01;
  Float *in_stack_fffffffffffffaa8;
  array<float,_4> *in_stack_fffffffffffffab0;
  Tuple2<pbrt::Point2,_float> *this_02;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  int i_00;
  optional<pbrt::ShapeSample> *t1;
  undefined4 in_stack_fffffffffffffae0;
  Float in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf4;
  float in_stack_fffffffffffffaf8;
  float in_stack_fffffffffffffafc;
  Interaction local_500;
  float local_498;
  undefined8 local_490;
  float local_488;
  undefined8 local_480;
  float local_478;
  undefined8 local_470;
  float local_468;
  undefined8 local_460;
  float local_458;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  Point3fi local_3a4;
  undefined8 local_388;
  float local_380;
  undefined8 local_374;
  float local_36c;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_32c;
  float local_324;
  Tuple3<pbrt::Vector3,_float> local_320;
  undefined8 local_310;
  float local_308;
  undefined8 local_300;
  float local_2f8;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  Tuple3<pbrt::Vector3,_float> local_2d4;
  Tuple3<pbrt::Vector3,_float> local_2c8;
  Tuple3<pbrt::Vector3,_float> local_2b8;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  Interval<float> local_288;
  float local_280;
  Point3fi local_278;
  float local_260;
  Interval<float> local_258;
  float local_250;
  Tuple2<pbrt::Point2,_float> local_238;
  Tuple2<pbrt::Point2,_float> local_220;
  Tuple2<pbrt::Point2,_float> local_218;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  type local_90;
  type local_8c;
  type local_88;
  type local_84;
  type *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  Tuple2<pbrt::Point2,_float> local_60;
  Tuple2<pbrt::Point2,_float> local_58;
  Float local_4c;
  Point3f *local_48;
  Point3f *local_40;
  Point3f *local_38;
  Point3f *local_30;
  int *local_28;
  BilinearPatchMesh *local_20;
  Tuple2<pbrt::Point2,_float> local_10;
  undefined1 auVar29 [64];
  undefined1 extraout_var [56];
  undefined1 auVar39 [56];
  undefined1 extraout_var_03 [56];
  
  local_10 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  t1 = in_RDI;
  local_20 = GetMesh((BilinearPatch *)0x4659cf);
  local_28 = local_20->vertexIndices + ((int)in_RSI->y << 2);
  local_30 = local_20->p + *local_28;
  local_38 = local_20->p + local_28[1];
  local_40 = local_20->p + local_28[2];
  local_48 = local_20->p + local_28[3];
  auVar39 = (undefined1  [56])0x0;
  local_4c = 1.0;
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  if (local_20->imageDistribution == (PiecewiseConstant2D *)0x0) {
    bVar1 = IsRectangle((BilinearPatch *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    if (bVar1) {
      local_58 = local_10;
    }
    else {
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_b8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar7._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar39;
      local_c0 = vmovlpd_avx(auVar7._0_16_);
      local_b0 = local_c0;
      local_a8 = local_b8;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_d8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar39;
      local_e0 = vmovlpd_avx(auVar8._0_16_);
      local_d0 = local_e0;
      local_c8 = local_d8;
      VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa90,
                            (Vector3<float> *)in_stack_fffffffffffffa88);
      local_e8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar9._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar39;
      local_f0 = vmovlpd_avx(auVar9._0_16_);
      local_a0 = local_f0;
      local_98 = local_e8;
      local_90 = Length<float>((Vector3<float> *)0x465bf5);
      auVar39 = extraout_var_00;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_118 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar10._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar39;
      local_120 = vmovlpd_avx(auVar10._0_16_);
      local_110 = local_120;
      local_108 = local_118;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_138 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar11._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar39;
      local_140 = vmovlpd_avx(auVar11._0_16_);
      local_130 = local_140;
      local_128 = local_138;
      VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa90,
                            (Vector3<float> *)in_stack_fffffffffffffa88);
      local_148 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar39;
      local_150 = vmovlpd_avx(auVar12._0_16_);
      local_100 = local_150;
      local_f8 = local_148;
      local_8c = Length<float>((Vector3<float> *)0x465cda);
      auVar39 = extraout_var_01;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_178 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar39;
      local_180 = vmovlpd_avx(auVar13._0_16_);
      local_170 = local_180;
      local_168 = local_178;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_198 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar39;
      local_1a0 = vmovlpd_avx(auVar14._0_16_);
      local_190 = local_1a0;
      local_188 = local_198;
      VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa90,
                            (Vector3<float> *)in_stack_fffffffffffffa88);
      local_1a8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar39;
      local_1b0 = vmovlpd_avx(auVar15._0_16_);
      local_160 = local_1b0;
      local_158 = local_1a8;
      local_88 = Length<float>((Vector3<float> *)0x465dbf);
      auVar39 = extraout_var_02;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_1d8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar39;
      local_1e0 = vmovlpd_avx(auVar16._0_16_);
      local_1d0 = local_1e0;
      local_1c8 = local_1d8;
      VVar41 = Point3<float>::operator-
                         ((Point3<float> *)in_stack_fffffffffffffa90,
                          (Point3<float> *)in_stack_fffffffffffffa88);
      local_1f8 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar39;
      local_200 = vmovlpd_avx(auVar17._0_16_);
      local_1f0 = local_200;
      local_1e8 = local_1f8;
      VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa90,
                            (Vector3<float> *)in_stack_fffffffffffffa88);
      local_208 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar39;
      local_210 = vmovlpd_avx(auVar18._0_16_);
      local_1c0 = local_210;
      local_1b8 = local_208;
      local_84 = Length<float>((Vector3<float> *)0x465ea4);
      local_80 = &local_90;
      local_78 = 4;
      v_00._M_array._4_4_ = in_stack_fffffffffffffabc;
      v_00._M_array._0_4_ = in_stack_fffffffffffffab8;
      v_00._M_len = (size_type)local_70;
      pstd::array<float,_4>::array(in_stack_fffffffffffffab0,v_00);
      local_220 = local_10;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                (in_stack_fffffffffffffa90,(array<float,_4> *)in_stack_fffffffffffffa88);
      u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffafc;
      u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffaf8;
      w_01._4_8_ = in_stack_fffffffffffffaec;
      w_01.ptr._0_4_ = in_stack_fffffffffffffae8;
      w_01.n._4_4_ = in_stack_fffffffffffffaf4;
      auVar19._0_8_ = SampleBilinear(u_00,w_01);
      auVar19._8_56_ = extraout_var_03;
      local_238 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar19._0_16_);
      local_218 = local_238;
      local_58 = local_238;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                (in_stack_fffffffffffffa90,(array<float,_4> *)in_stack_fffffffffffffa88);
      w_00.n._0_4_ = in_stack_fffffffffffffae0;
      w_00.ptr = &in_RSI->x;
      w_00.n._4_4_ = in_stack_fffffffffffffae4;
      local_4c = BilinearPDF((Point2f)in_stack_fffffffffffffaec,w_00);
    }
  }
  else {
    auVar6._0_8_ = PiecewiseConstant2D::Sample
                             ((PiecewiseConstant2D *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                              (Point2f *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    auVar6._8_56_ = extraout_var;
    local_60 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar6._0_16_);
    local_58 = local_60;
  }
  this_02 = &local_58;
  i = 1;
  Tuple2<pbrt::Point2,_float>::operator[](this_02,1);
  auVar39 = (undefined1  [56])0x0;
  PVar40 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffae4,in_RSI,(Tuple3<pbrt::Point3,_float> *)t1);
  local_260 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar39;
  local_278.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z = (Interval<float>)vmovlpd_avx(auVar20._0_16_);
  local_258 = local_278.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  local_250 = local_260;
  Tuple2<pbrt::Point2,_float>::operator[](this_02,i);
  auVar39 = (undefined1  [56])0x0;
  PVar40 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffae4,in_RSI,(Tuple3<pbrt::Point3,_float> *)t1);
  local_280 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar21._8_56_ = auVar39;
  local_288 = (Interval<float>)vmovlpd_avx(auVar21._0_16_);
  i_00 = 0;
  local_278.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x = local_288;
  local_278.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = local_280;
  Tuple2<pbrt::Point2,_float>::operator[](this_02,0);
  auVar39 = (undefined1  [56])0x0;
  this_01 = &local_278;
  PVar40 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffae4,in_RSI,(Tuple3<pbrt::Point3,_float> *)t1);
  local_2a0 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
  auVar22._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar22._8_56_ = auVar39;
  local_2a8 = vmovlpd_avx(auVar22._0_16_);
  local_298 = local_2a8;
  local_290 = local_2a0;
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffa90,
                      (Point3<float> *)in_stack_fffffffffffffa88);
  local_2c8.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar39;
  local_2c8._0_8_ = vmovlpd_avx(auVar23._0_16_);
  local_2b8._0_8_ = local_2c8._0_8_;
  local_2b8.z = local_2c8.z;
  Tuple2<pbrt::Point2,_float>::operator[](this_02,i_00);
  auVar39 = (undefined1  [56])0x0;
  PVar40 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffae4,in_RSI,(Tuple3<pbrt::Point3,_float> *)t1);
  local_2e8 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
  auVar24._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar24._8_56_ = auVar39;
  local_2f0 = vmovlpd_avx(auVar24._0_16_);
  local_2e0 = local_2f0;
  local_2d8 = local_2e8;
  Tuple2<pbrt::Point2,_float>::operator[](this_02,i_00);
  auVar39 = (undefined1  [56])0x0;
  PVar40 = Lerp<pbrt::Point3,float>
                     (in_stack_fffffffffffffae4,in_RSI,(Tuple3<pbrt::Point3,_float> *)t1);
  local_308 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar25._8_56_ = auVar39;
  local_310 = vmovlpd_avx(auVar25._0_16_);
  local_300 = local_310;
  local_2f8 = local_308;
  VVar41 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffa90,
                      (Point3<float> *)in_stack_fffffffffffffa88);
  local_320.z = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar39;
  local_320._0_8_ = vmovlpd_avx(auVar26._0_16_);
  local_2d4._0_8_ = local_320._0_8_;
  local_2d4.z = local_320.z;
  fVar2 = LengthSquared<float>((Vector3<float> *)&local_2b8);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = LengthSquared<float>((Vector3<float> *)&local_2d4);
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      auVar39 = extraout_var_04;
      VVar41 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffa90,
                            (Vector3<float> *)in_stack_fffffffffffffa88);
      local_350 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar27._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar27._8_56_ = auVar39;
      local_358 = vmovlpd_avx(auVar27._0_16_);
      local_348 = local_358;
      local_340 = local_350;
      VVar41 = Normalize<float>((Vector3<float> *)this_01);
      local_360 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar28._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar28._8_56_ = auVar39;
      local_368 = vmovlpd_avx(auVar28._0_16_);
      local_338 = local_368;
      local_330 = local_360;
      Normal3<float>::Normal3<float>
                ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (Vector3<float> *)in_stack_fffffffffffffa78);
      TVar42.z = local_380;
      TVar42.x = (float)(int)auVar28._0_8_;
      TVar42.y = (float)(int)((ulong)auVar28._0_8_ >> 0x20);
      auVar39 = auVar28._8_56_;
      if ((local_20->reverseOrientation & 1U) != (local_20->transformSwapsHandedness & 1U)) {
        TVar42 = (Tuple3<pbrt::Normal3,_float>)
                 Tuple3<pbrt::Normal3,_float>::operator-
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        local_36c = TVar42.z;
        auVar29._0_8_ = TVar42._0_8_;
        auVar29._8_56_ = auVar39;
        local_388 = vmovlpd_avx(auVar29._0_16_);
        local_374 = local_388;
        local_32c = local_388;
        local_324 = local_36c;
      }
      local_380 = TVar42.z;
      dVar5 = pbrt::gamma(TVar42._0_8_);
      uVar3 = SUB84(dVar5,0);
      auVar39 = extraout_var_05;
      PVar40 = Abs<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90);
      auVar30._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar30._8_56_ = auVar39;
      vmovlpd_avx(auVar30._0_16_);
      PVar40 = Abs<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90);
      auVar31._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar31._8_56_ = auVar39;
      vmovlpd_avx(auVar31._0_16_);
      PVar40 = Max<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90,
                          in_stack_fffffffffffffa88);
      auVar32._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar32._8_56_ = auVar39;
      local_410 = vmovlpd_avx(auVar32._0_16_);
      PVar40 = Abs<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90);
      local_438 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
      auVar33._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar33._8_56_ = auVar39;
      local_440 = vmovlpd_avx(auVar33._0_16_);
      local_430 = local_440;
      local_428 = local_438;
      PVar40 = Abs<pbrt::Point3,float>((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90);
      local_458 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
      auVar34._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar34._8_56_ = auVar39;
      local_460 = vmovlpd_avx(auVar34._0_16_);
      local_450 = local_460;
      local_448 = local_458;
      PVar40 = Max<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90,
                          in_stack_fffffffffffffa88);
      local_468 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
      auVar35._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar35._8_56_ = auVar39;
      local_470 = vmovlpd_avx(auVar35._0_16_);
      local_420 = local_470;
      local_418 = local_468;
      PVar40 = Max<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffa90,
                          in_stack_fffffffffffffa88);
      local_478 = PVar40.super_Tuple3<pbrt::Point3,_float>.z;
      auVar36._0_8_ = PVar40.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar36._8_56_ = auVar39;
      local_480 = vmovlpd_avx(auVar36._0_16_);
      pi = &local_3a4;
      Vector3<float>::Vector3<float>
                ((Vector3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffa80),
                 (Point3<float> *)in_stack_fffffffffffffa78);
      auVar39 = (undefined1  [56])0x0;
      VVar41 = pbrt::operator*((float)((ulong)this_01 >> 0x20),
                               (Tuple3<pbrt::Vector3,_float> *)CONCAT44(i,in_stack_fffffffffffffa98)
                              );
      local_488 = VVar41.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar37._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar39;
      local_490 = vmovlpd_avx(auVar37._0_16_);
      this_00 = &local_500;
      local_3a4.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._12_8_ = local_490;
      local_3a4.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = local_488;
      Point3fi::Point3fi(this_01,(Point3f *)CONCAT44(i,in_stack_fffffffffffffa98),
                         (Vector3f *)this_00);
      Interaction::Interaction
                (this_00,pi,(Normal3f *)CONCAT44(uVar3,in_stack_fffffffffffffa80),
                 (Point2f *)in_stack_fffffffffffffa78);
      auVar39 = (undefined1  [56])0x0;
      FVar43 = local_4c;
      VVar41 = Cross<float>((Vector3<float> *)this_00,(Vector3<float> *)pi);
      auVar38._0_8_ = VVar41.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar38._8_56_ = auVar39;
      vmovlpd_avx(auVar38._0_16_);
      tVar4 = Length<float>((Vector3<float> *)0x46661e);
      local_498 = FVar43 / tVar4;
      pstd::optional<pbrt::ShapeSample>::optional
                ((optional<pbrt::ShapeSample> *)CONCAT44(uVar3,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa78);
      return t1;
    }
  }
  memset(in_RDI,0,0x60);
  pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
  return t1;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Sample bilinear patch parametric $(u,v)$ coordinates
    Float pdf = 1;
    Point2f uv;
    if (mesh->imageDistribution)
        uv = mesh->imageDistribution->Sample(u, &pdf);
    else if (!IsRectangle()) {
        // Sample patch $(u,v)$ with approximate uniform area sampling
        // Initialize _w_ array with differential area at bilinear patch corners
        pstd::array<Float, 4> w = {
            Length(Cross(p10 - p00, p01 - p00)), Length(Cross(p10 - p00, p11 - p10)),
            Length(Cross(p01 - p00, p11 - p01)), Length(Cross(p11 - p10, p11 - p01))};

        uv = SampleBilinear(u, w);
        pdf = BilinearPDF(uv, w);

    } else
        uv = u;

    // Compute position, $\dpdu$, and $\dpdv$ for sampled bilinear patch $(u,v)$
    Point3f pu0 = Lerp(uv[1], p00, p01), pu1 = Lerp(uv[1], p10, p11);
    Point3f p = Lerp(uv[0], pu0, pu1);
    Vector3f dpdu = pu1 - pu0;
    Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);
    if (LengthSquared(dpdu) == 0 || LengthSquared(dpdv) == 0)
        return {};

    // Compute surface normal for sampled bilinear patch $(u,v)$
    Normal3f n = Normal3f(Normalize(Cross(dpdu, dpdv)));
    if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
        n = -n;

    // Compute _pError_ for sampled bilinear patch $(u,v)$
    Vector3f pError =
        gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

    // Return _ShapeSample_ for sampled bilinear patch point
    return ShapeSample{Interaction(Point3fi(p, pError), n, uv),
                       pdf / Length(Cross(dpdu, dpdv))};
}